

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

btScalar __thiscall btRaycastVehicle::rayCast(btRaycastVehicle *this,btWheelInfo *wheel)

{
  btVector3 *v;
  btVector3 *v1;
  btVector3 *v1_00;
  float fVar1;
  long lVar2;
  btScalar bVar3;
  float fVar4;
  float fVar5;
  btScalar bVar6;
  btVector3 bVar7;
  btScalar raylen;
  btVehicleRaycasterResult rayResults;
  btVector3 relpos;
  btVector3 rayvector;
  float local_74;
  float local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  float local_4c;
  btVector3 local_48;
  btVector3 local_38;
  
  updateWheelTransformsWS(this,wheel,false);
  bVar3 = btWheelInfo::getSuspensionRestLength(wheel);
  local_74 = bVar3 + wheel->m_wheelsRadius;
  v = &(wheel->m_raycastInfo).m_wheelDirectionWS;
  local_38 = operator*(v,&local_74);
  v1 = &(wheel->m_raycastInfo).m_hardPointWS;
  bVar7 = operator+(v1,&local_38);
  v1_00 = &(wheel->m_raycastInfo).m_contactPointWS;
  *&(wheel->m_raycastInfo).m_contactPointWS.m_floats = bVar7.m_floats;
  local_4c = -1.0;
  lVar2 = (**(code **)(*(long *)this->m_vehicleRaycaster + 0x10))(this->m_vehicleRaycaster,v1,v1_00)
  ;
  fVar1 = local_4c;
  (wheel->m_raycastInfo).m_groundObject = (void *)0x0;
  if (lVar2 == 0) {
    bVar3 = btWheelInfo::getSuspensionRestLength(wheel);
    (wheel->m_raycastInfo).m_suspensionLength = bVar3;
    wheel->m_suspensionRelativeVelocity = 0.0;
    bVar7 = operator-(v);
    *&(wheel->m_raycastInfo).m_contactNormalWS.m_floats = bVar7.m_floats;
    wheel->m_clippedInvContactDotSuspension = 1.0;
    local_70 = -1.0;
  }
  else {
    local_70 = local_74 * local_4c;
    *(undefined8 *)(wheel->m_raycastInfo).m_contactNormalWS.m_floats = local_5c;
    *(undefined8 *)((wheel->m_raycastInfo).m_contactNormalWS.m_floats + 2) = uStack_54;
    (wheel->m_raycastInfo).m_isInContact = true;
    btActionInterface::getFixedBody();
    (wheel->m_raycastInfo).m_groundObject = &btActionInterface::getFixedBody::s_fixed;
    (wheel->m_raycastInfo).m_suspensionLength = fVar1 * local_74 - wheel->m_wheelsRadius;
    bVar3 = btWheelInfo::getSuspensionRestLength(wheel);
    fVar4 = bVar3 - wheel->m_maxSuspensionTravelCm * 0.01;
    bVar3 = btWheelInfo::getSuspensionRestLength(wheel);
    fVar5 = wheel->m_maxSuspensionTravelCm * 0.01 + bVar3;
    fVar1 = (wheel->m_raycastInfo).m_suspensionLength;
    if ((fVar1 < fVar4) || (fVar4 = fVar1, fVar5 < fVar1)) {
      if (fVar4 <= fVar5) {
        fVar5 = fVar4;
      }
      (wheel->m_raycastInfo).m_suspensionLength = fVar5;
    }
    *(undefined8 *)v1_00->m_floats = local_6c;
    *(undefined8 *)((wheel->m_raycastInfo).m_contactPointWS.m_floats + 2) = uStack_64;
    bVar3 = btVector3::dot((btVector3 *)wheel,v);
    local_48 = operator-(v1_00,&(this->m_chassisBody->super_btCollisionObject).m_worldTransform.
                                m_origin);
    bVar7 = btRigidBody::getVelocityInLocalPoint(this->m_chassisBody,&local_48);
    if (-0.1 <= bVar3) {
      bVar3 = 10.0;
      bVar6 = 0.0;
    }
    else {
      bVar3 = -1.0 / bVar3;
      bVar6 = (bVar7.m_floats[2] * (wheel->m_raycastInfo).m_contactNormalWS.m_floats[2] +
              (wheel->m_raycastInfo).m_contactNormalWS.m_floats[0] * bVar7.m_floats[0] +
              bVar7.m_floats[1] * (wheel->m_raycastInfo).m_contactNormalWS.m_floats[1]) * bVar3;
    }
    wheel->m_suspensionRelativeVelocity = bVar6;
    wheel->m_clippedInvContactDotSuspension = bVar3;
  }
  return local_70;
}

Assistant:

btScalar btRaycastVehicle::rayCast(btWheelInfo& wheel)
{
	updateWheelTransformsWS( wheel,false);

	
	btScalar depth = -1;
	
	btScalar raylen = wheel.getSuspensionRestLength()+wheel.m_wheelsRadius;

	btVector3 rayvector = wheel.m_raycastInfo.m_wheelDirectionWS * (raylen);
	const btVector3& source = wheel.m_raycastInfo.m_hardPointWS;
	wheel.m_raycastInfo.m_contactPointWS = source + rayvector;
	const btVector3& target = wheel.m_raycastInfo.m_contactPointWS;

	btScalar param = btScalar(0.);
	
	btVehicleRaycaster::btVehicleRaycasterResult	rayResults;

	btAssert(m_vehicleRaycaster);

	void* object = m_vehicleRaycaster->castRay(source,target,rayResults);

	wheel.m_raycastInfo.m_groundObject = 0;

	if (object)
	{
		param = rayResults.m_distFraction;
		depth = raylen * rayResults.m_distFraction;
		wheel.m_raycastInfo.m_contactNormalWS  = rayResults.m_hitNormalInWorld;
		wheel.m_raycastInfo.m_isInContact = true;
		
		wheel.m_raycastInfo.m_groundObject = &getFixedBody();///@todo for driving on dynamic/movable objects!;
		//wheel.m_raycastInfo.m_groundObject = object;


		btScalar hitDistance = param*raylen;
		wheel.m_raycastInfo.m_suspensionLength = hitDistance - wheel.m_wheelsRadius;
		//clamp on max suspension travel

		btScalar  minSuspensionLength = wheel.getSuspensionRestLength() - wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		btScalar maxSuspensionLength = wheel.getSuspensionRestLength()+ wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		if (wheel.m_raycastInfo.m_suspensionLength < minSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = minSuspensionLength;
		}
		if (wheel.m_raycastInfo.m_suspensionLength > maxSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = maxSuspensionLength;
		}

		wheel.m_raycastInfo.m_contactPointWS = rayResults.m_hitPointInWorld;

		btScalar denominator= wheel.m_raycastInfo.m_contactNormalWS.dot( wheel.m_raycastInfo.m_wheelDirectionWS );

		btVector3 chassis_velocity_at_contactPoint;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS-getRigidBody()->getCenterOfMassPosition();

		chassis_velocity_at_contactPoint = getRigidBody()->getVelocityInLocalPoint(relpos);

		btScalar projVel = wheel.m_raycastInfo.m_contactNormalWS.dot( chassis_velocity_at_contactPoint );

		if ( denominator >= btScalar(-0.1))
		{
			wheel.m_suspensionRelativeVelocity = btScalar(0.0);
			wheel.m_clippedInvContactDotSuspension = btScalar(1.0) / btScalar(0.1);
		}
		else
		{
			btScalar inv = btScalar(-1.) / denominator;
			wheel.m_suspensionRelativeVelocity = projVel * inv;
			wheel.m_clippedInvContactDotSuspension = inv;
		}
			
	} else
	{
		//put wheel info as in rest position
		wheel.m_raycastInfo.m_suspensionLength = wheel.getSuspensionRestLength();
		wheel.m_suspensionRelativeVelocity = btScalar(0.0);
		wheel.m_raycastInfo.m_contactNormalWS = - wheel.m_raycastInfo.m_wheelDirectionWS;
		wheel.m_clippedInvContactDotSuspension = btScalar(1.0);
	}

	return depth;
}